

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall CompilerContext::compile_repeat(CompilerContext *this,SyntaxTree *repeat_node)

{
  vector<CompiledData,_std::allocator<CompiledData>_> *this_00;
  pointer psVar1;
  SyntaxTree *arg_node;
  SyntaxTree *arg_node_00;
  RepeatAnnotation *pRVar2;
  Command *pCVar3;
  long lVar4;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_00;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_01;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_02;
  allocator_type local_171;
  shared_ptr<Label> loop_ptr;
  shared_ptr<Label> break_ptr;
  shared_ptr<Label> continue_ptr;
  undefined1 local_130 [56];
  ArgVariant local_f8;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> local_a0;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_90;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_78;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_60;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_48;
  
  pRVar2 = linb::any_cast<RepeatAnnotation_const&>(&repeat_node->udata);
  psVar1 = (repeat_node->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  arg_node = (psVar1->super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  arg_node_00 = psVar1[1].super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  make_internal_label((CompilerContext *)&continue_ptr);
  make_internal_label((CompilerContext *)&break_ptr);
  make_internal_label((CompilerContext *)&loop_ptr);
  std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)local_130,
             &continue_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)(local_130 + 0x10),
             &break_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::
  emplace_back<CompilerContext::LoopInfo>(&this->loop_stack,(LoopInfo *)local_130);
  LoopInfo::~LoopInfo((LoopInfo *)local_130);
  pCVar3 = pRVar2->set_var_to_zero;
  get_arg((ArgVariant *)local_130,this,arg_node_00);
  get_arg(&local_f8,this,&pRVar2->number_zero);
  __l._M_len = 2;
  __l._M_array = (iterator)local_130;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_48,__l,&local_171);
  compile_command(this,pCVar3,&local_48,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_48);
  lVar4 = 0x38;
  do {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                 *)(local_130 + lVar4));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x38);
  std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,&loop_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>);
  this_00 = &this->compiled;
  std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
            ((vector<CompiledData,std::allocator<CompiledData>> *)this_00,
             (shared_ptr<Label> *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  compile_statements(this,(repeat_node->childs).
                          super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,&continue_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
            ((vector<CompiledData,std::allocator<CompiledData>> *)this_00,
             (shared_ptr<Label> *)&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  pCVar3 = pRVar2->add_var_with_one;
  get_arg((ArgVariant *)local_130,this,arg_node_00);
  get_arg(&local_f8,this,&pRVar2->number_one);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_130;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_60,__l_00,&local_171);
  compile_command(this,pCVar3,&local_60,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_60);
  lVar4 = 0x38;
  do {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                 *)(local_130 + lVar4));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x38);
  pCVar3 = pRVar2->is_var_geq_times;
  get_arg((ArgVariant *)local_130,this,arg_node_00);
  get_arg(&local_f8,this,arg_node);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_130;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_78,__l_01,&local_171);
  compile_command(this,pCVar3,&local_78,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_78);
  lVar4 = 0x38;
  do {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                 *)(local_130 + lVar4));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x38);
  pCVar3 = std::experimental::optional<const_Command_&>::operator*(&this->commands->goto_if_false);
  eggs::variants::
  variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>::
  variant<std::shared_ptr<Label>&,5ul,std::shared_ptr<Label>>
            ((variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
              *)local_130,&loop_ptr);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_130;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_90,__l_02,&local_171);
  compile_command(this,pCVar3,&local_90,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_90);
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
  ::~_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
               *)local_130);
  std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c0,&break_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
            ((vector<CompiledData,std::allocator<CompiledData>> *)this_00,
             (shared_ptr<Label> *)&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::pop_back
            (&this->loop_stack);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&loop_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&break_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&continue_ptr.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void CompilerContext::compile_repeat(const SyntaxTree& repeat_node)
{
    auto& annotation = repeat_node.annotation<const RepeatAnnotation&>();
    auto& times = repeat_node.child(0);
    auto& var = repeat_node.child(1);

    auto continue_ptr = make_internal_label();
    auto break_ptr    = make_internal_label();
    auto loop_ptr     = make_internal_label();

    loop_stack.emplace_back(LoopInfo { continue_ptr, break_ptr });

    compile_command(annotation.set_var_to_zero, { get_arg(var), get_arg(annotation.number_zero) });
    compile_label(loop_ptr);
    compile_statements(repeat_node.child(2));
    compile_label(continue_ptr);
    compile_command(annotation.add_var_with_one, { get_arg(var), get_arg(annotation.number_one) });
    compile_command(annotation.is_var_geq_times, { get_arg(var), get_arg(times) });
    compile_command(*this->commands.goto_if_false, { loop_ptr });
    compile_label(break_ptr);

    loop_stack.pop_back();
}